

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O2

void FAudioFXReverb_Reset(FAudioFXReverb *fapo)

{
  long lVar1;
  DspAllPass *pDVar2;
  long lVar3;
  DspDelay *pDVar4;
  DspDelay *filter;
  DspDelay *filter_00;
  bool bVar5;
  
  FAPOBase_Reset(&fapo->base);
  DspDelay_Reset(&(fapo->reverb).early_delay);
  DspDelay_Reset(&(fapo->reverb).apf_in[0].delay);
  pDVar4 = &(fapo->reverb).channel[0].lpf_comb[0].comb_delay;
  pDVar2 = (fapo->reverb).channel[0].apf_out;
  for (lVar3 = 0; lVar3 < (fapo->reverb).reverb_channels; lVar3 = lVar3 + 1) {
    filter = &(fapo->reverb).channel[lVar3].reverb_delay;
    DspDelay_Reset(filter);
    lVar1 = 8;
    filter_00 = pDVar4;
    while (bVar5 = lVar1 != 0, lVar1 = lVar1 + -1, bVar5) {
      DspDelay_Reset(filter_00);
      filter_00[2].capacity = 0;
      filter_00[2].delay = 0;
      filter_00[3].read_idx = 0;
      filter_00[3].write_idx = 0;
      filter_00 = (DspDelay *)&filter_00[3].buffer;
    }
    filter[0x25].sampleRate = 0;
    filter[0x25].capacity = 0;
    for (lVar1 = 0; lVar1 != 0xa0; lVar1 = lVar1 + 0x28) {
      DspDelay_Reset((DspDelay *)((long)&(pDVar2->delay).sampleRate + lVar1));
    }
    pDVar4 = (DspDelay *)&pDVar4[0x25].write_idx;
    pDVar2 = pDVar2 + 0x1e;
  }
  return;
}

Assistant:

void FAudioFXReverb_Reset(FAudioFXReverb *fapo)
{
	int32_t i, c;
	FAPOBase_Reset(&fapo->base);

	/* Reset the cached state of the reverb filter */
	DspDelay_Reset(&fapo->reverb.early_delay);

	for (i = 0; i < REVERB_COUNT_APF_IN; i += 1)
	{
		DspAllPass_Reset(&fapo->reverb.apf_in[i]);
	}

	for (c = 0; c < fapo->reverb.reverb_channels; c += 1)
	{
		DspDelay_Reset(&fapo->reverb.channel[c].reverb_delay);

		for (i = 0; i < REVERB_COUNT_COMB; i += 1)
		{
			DspCombShelving_Reset(&fapo->reverb.channel[c].lpf_comb[i]);
		}

		DspBiQuad_Reset(&fapo->reverb.channel[c].room_high_shelf);

		for (i = 0; i < REVERB_COUNT_APF_OUT; i += 1)
		{
			DspAllPass_Reset(&fapo->reverb.channel[c].apf_out[i]);
		}
	}
}